

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::UncommittedRegionsAccessTestCase::iterate(UncommittedRegionsAccessTestCase *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  char *description;
  uint *puVar4;
  qpTestResult testResult;
  TestContext *this_01;
  int l;
  uint level;
  uint *puVar5;
  GLuint texture;
  string *local_1e0;
  ostream *local_1d8;
  allocator<char> local_1d0 [32];
  undefined1 local_1b0 [384];
  Functions *gl;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_contextInfo
                     ,"GL_ARB_sparse_texture2");
  if (bVar1) {
    iVar2 = (*((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar2);
    local_1e0 = (string *)
                &(this->super_SparseTexture2CommitmentTestCase).
                 super_SparseTextureCommitmentTestCase.field_0x90;
    local_1d8 = (ostream *)
                &(this->super_SparseTexture2CommitmentTestCase).
                 super_SparseTextureCommitmentTestCase.field_0x88;
    bVar1 = true;
    for (puVar4 = (uint *)(this->super_SparseTexture2CommitmentTestCase).
                          super_SparseTextureCommitmentTestCase.mSupportedTargets.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
        puVar4 != (uint *)(this->super_SparseTexture2CommitmentTestCase).
                          super_SparseTextureCommitmentTestCase.mSupportedTargets.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
      for (puVar5 = (uint *)(this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
          puVar5 != (uint *)(this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
        iVar2 = (*(this->super_SparseTexture2CommitmentTestCase).
                  super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode
                  ._vptr_TestNode[6])(this,(ulong)*puVar4,(ulong)*puVar5);
        if ((char)iVar2 != '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,local_1d0);
          std::__cxx11::stringbuf::str(local_1e0);
          std::__cxx11::string::~string((string *)local_1b0);
          poVar3 = std::operator<<(local_1d8,"Testing uncommitted regions access for target: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*puVar4);
          poVar3 = std::operator<<(poVar3,", format: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*puVar5);
          std::operator<<(poVar3," - ");
          (*(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
            super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[8])
                    (this,gl,(ulong)*puVar4,(ulong)*puVar5,&texture,3);
          level = 0;
          do {
            if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .mState.levels <= (int)level) break;
            iVar2 = (*(this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0xc])
                              (this,gl,(ulong)*puVar4,(ulong)*puVar5,&texture,(ulong)level);
            if ((char)iVar2 != '\0') {
              (*(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[10])
                        (this,gl,(ulong)*puVar4,(ulong)*puVar5,&texture,(ulong)level);
              if (((bVar1 == false) ||
                  (bVar1 = UncommittedReads(this,gl,*puVar4,*puVar5,&texture,level), !bVar1)) ||
                 (bVar1 = UncommittedAtomicOperations(this,gl,*puVar4,*puVar5,&texture,level),
                 !bVar1)) {
                bVar1 = false;
                break;
              }
              bVar1 = UncommittedDepthStencil(this,gl,*puVar4,*puVar5,&texture,level);
            }
            level = level + 1;
          } while (bVar1 != false);
          gl4cts::Texture::Delete(gl,&texture);
          if (bVar1 == false) {
            local_1b0._0_8_ =
                 ((this->super_SparseTexture2CommitmentTestCase).
                  super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode
                 .m_testCtx)->m_log;
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__cxx11::stringbuf::str();
            std::operator<<((ostream *)this_00,(string *)local_1d0);
            std::operator<<((ostream *)this_00,"Fail");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)local_1d0);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            this_01 = (this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx;
            description = "Fail";
            testResult = QP_TEST_RESULT_FAIL;
            goto LAB_00adaa3a;
          }
        }
      }
    }
    this_01 = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
LAB_00adaa3a:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult UncommittedRegionsAccessTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			mLog.str("");
			mLog << "Testing uncommitted regions access for target: " << target << ", format: " << format << " - ";

			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = result && UncommittedReads(gl, target, format, texture, l);
					result = result && UncommittedAtomicOperations(gl, target, format, texture, l);
					result = result && UncommittedDepthStencil(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}